

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_state.hpp
# Opt level: O0

void __thiscall libtorrent::dht::dht_state::~dht_state(dht_state *this)

{
  dht_state *this_local;
  
  std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ::~vector(&this->nodes6);
  std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ::~vector(&this->nodes);
  std::
  vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ::~vector(&this->nids);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_state
	{
		node_ids_t nids;

		// the bootstrap nodes saved from the buckets node
		std::vector<udp::endpoint> nodes;
		// the bootstrap nodes saved from the IPv6 buckets node
		std::vector<udp::endpoint> nodes6;

		void clear();
	}